

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  KeyInfo *zP4;
  int iVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  
  iVar1 = pAggInfo->nColumn;
  if (pAggInfo->nFunc + iVar1 != 0) {
    p = pParse->pVdbe;
    lVar2 = 0x14;
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      sqlite3VdbeAddOp2(p,10,0,*(int *)((long)&pAggInfo->aCol->pTab + lVar2));
      iVar1 = pAggInfo->nColumn;
      lVar2 = lVar2 + 0x20;
    }
    piVar4 = &pAggInfo->aFunc->iDistinct;
    for (iVar1 = 0; iVar1 < pAggInfo->nFunc; iVar1 = iVar1 + 1) {
      sqlite3VdbeAddOp2(p,10,0,piVar4[-1]);
      if (-1 < *piVar4) {
        pList = (((AggInfo_func *)(piVar4 + -5))->pExpr->x).pList;
        if ((pList == (ExprList *)0x0) || (pList->nExpr != 1)) {
          sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
          *piVar4 = -1;
        }
        else {
          zP4 = keyInfoFromExprList(pParse,pList);
          sqlite3VdbeAddOp4(p,0x2a,*piVar4,0,0,(char *)zP4,-0x10);
        }
      }
      piVar4 = piVar4 + 6;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  if( pAggInfo->nFunc+pAggInfo->nColumn==0 ){
    return;
  }
  for(i=0; i<pAggInfo->nColumn; i++){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pAggInfo->aCol[i].iMem);
  }
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pFunc->iMem);
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pExpr;
      assert( !ExprHasProperty(pE, EP_xIsSelect) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = keyInfoFromExprList(pParse, pE->x.pList);
        sqlite3VdbeAddOp4(v, OP_OpenEphemeral, pFunc->iDistinct, 0, 0,
                          (char*)pKeyInfo, P4_KEYINFO_HANDOFF);
      }
    }
  }
}